

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElement.cpp
# Opt level: O2

string * __thiscall
iDynTree::XMLElement::description_abi_cxx11_(string *__return_storage_ptr__,XMLElement *this)

{
  XMLElementPimpl *pXVar1;
  pointer psVar2;
  ostream *poVar3;
  shared_ptr<iDynTree::XMLElement> *child;
  __node_base *p_Var4;
  pointer psVar5;
  ostringstream str;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::operator<<((ostream *)local_1a8,"<");
  std::operator<<(poVar3,(string *)
                         &((this->m_pimpl)._M_t.
                           super___uniq_ptr_impl<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                           .super__Head_base<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_false>.
                          _M_head_impl)->m_name);
  p_Var4 = (__node_base *)
           ((long)&(((this->m_pimpl)._M_t.
                     super___uniq_ptr_impl<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                     .super__Head_base<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_false>.
                    _M_head_impl)->m_attributes)._M_h + 0x10);
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    poVar3 = std::operator<<((ostream *)local_1a8," ");
    XMLAttribute::description_abi_cxx11_(&local_1c8,(XMLAttribute *)p_Var4[5]._M_nxt);
    std::operator<<(poVar3,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  poVar3 = std::operator<<((ostream *)local_1a8,">");
  std::endl<char,std::char_traits<char>>(poVar3);
  pXVar1 = (this->m_pimpl)._M_t.
           super___uniq_ptr_impl<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           .super__Head_base<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_false>._M_head_impl;
  psVar2 = *(pointer *)
            ((long)&(pXVar1->m_children).
                    super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
            + 8);
  for (psVar5 = *(pointer *)
                 &(pXVar1->m_children).
                  super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
                  ._M_impl; psVar5 != psVar2; psVar5 = psVar5 + 1) {
    description_abi_cxx11_
              (&local_1c8,
               (psVar5->super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              );
    poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  getParsedTextContent_abi_cxx11_(&local_1c8,this);
  std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  poVar3 = std::operator<<((ostream *)local_1a8,"</");
  poVar3 = std::operator<<(poVar3,(string *)
                                  &((this->m_pimpl)._M_t.
                                    super___uniq_ptr_impl<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                                    .
                                    super__Head_base<0UL,_iDynTree::XMLElement::XMLElementPimpl_*,_false>
                                   ._M_head_impl)->m_name);
  poVar3 = std::operator<<(poVar3,">");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string XMLElement::description() const
    {
        std::ostringstream str;
        str << "<" << m_pimpl->m_name;
        for (const auto& attribute : m_pimpl->m_attributes) {
            str << " " << attribute.second->description();
        }
        str << ">" << std::endl;
        for (const auto& child : m_pimpl->m_children) {
            str << child->description() << std::endl;
        }
        str << getParsedTextContent();
        str << "</" << m_pimpl->m_name << ">" << std::endl;
        return str.str();
    }